

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,PromiseClient *this
          ,uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  ClientHook *pCVar1;
  long *plVar2;
  undefined8 *local_78;
  long *local_70;
  undefined1 local_68 [8];
  undefined8 local_60;
  char local_58 [8];
  EventLoop *local_50;
  Event *pEStack_48;
  char local_40 [16];
  uint uStack_30;
  undefined4 uStack_2c;
  
  if (((this->isResolved == false) && (methodId == 0 && interfaceId == 0xc8cb212fcd9f5691)) &&
     ((((this->super_RpcClient).connectionState.ptr)->gateway).ptr.isSet == true)) {
    kj::_::ForkHub<kj::Own<capnp::ClientHook>_>::addBranch
              ((ForkHub<kj::Own<capnp::ClientHook>_> *)local_68);
    newLocalPromiseClient((capnp *)&local_78,(Promise<kj::Own<capnp::ClientHook>_> *)local_68);
    local_40[0] = (sizeHint->ptr).isSet;
    if ((bool)local_40[0] == true) {
      local_40._8_4_ = *(undefined4 *)&(sizeHint->ptr).field_1;
      local_40._12_4_ = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_30 = (sizeHint->ptr).field_1.value.capCount;
      uStack_2c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**(code **)*local_70)(__return_storage_ptr__,local_70,interfaceId,methodId,local_40);
    plVar2 = local_70;
    if (local_70 != (long *)0x0) {
      local_70 = (long *)0x0;
      (**(code **)*local_78)(local_78,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_60;
    if (local_60 != (long *)0x0) {
      local_60._0_4_ = 0;
      local_60._4_4_ = 0;
      (**(code **)*(_func_int **)local_68)(local_68,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  else {
    this->receivedCall = true;
    pCVar1 = (this->cap).ptr;
    local_58[0] = (sizeHint->ptr).isSet;
    if ((bool)local_58[0] == true) {
      local_50 = (EventLoop *)(sizeHint->ptr).field_1.value.wordCount;
      pEStack_48 = *(Event **)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar1->_vptr_ClientHook)(__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,local_58)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
      if (!isResolved && interfaceId == typeId<Persistent<>>() && methodId == 0 &&
          connectionState->gateway != nullptr) {
        // This is a call to Persistent.save(), and we're not resolved yet, and the underlying
        // remote capability will perform a gateway translation. This isn't right if the promise
        // ultimately resolves to a local capability. Instead, we'll need to queue the call until
        // the promise resolves.
        return newLocalPromiseClient(fork.addBranch())
            ->newCall(interfaceId, methodId, sizeHint);
      }

      receivedCall = true;
      return cap->newCall(interfaceId, methodId, sizeHint);
    }